

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::analysis::ConstantManager::FindDeclaredConstant
          (ConstantManager *this,Constant *c,uint32_t type_id)

{
  IRContext *this_00;
  uint32_t uVar1;
  const_iterator cVar2;
  _Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>
  _Var3;
  Instruction *this_01;
  _Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>
  _Var4;
  _Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>
  _Var5;
  pair<std::_Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>,_std::_Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>_>
  pVar6;
  key_type local_40;
  Constant *local_38;
  
  local_38 = c;
  cVar2 = std::
          _Hashtable<const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>,_std::__detail::_Identity,_spvtools::opt::analysis::ConstantEqual,_spvtools::opt::analysis::ConstantHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->const_pool_)._M_h,&local_38);
  if (cVar2.super__Node_iterator_base<const_spvtools::opt::analysis::Constant_*,_true>._M_cur !=
      (__node_type *)0x0) {
    local_40 = *(key_type *)
                ((long)cVar2.
                       super__Node_iterator_base<const_spvtools::opt::analysis::Constant_*,_true>.
                       _M_cur + 8);
    if (local_40 == (key_type)0x0) {
      return 0;
    }
    pVar6 = std::
            _Rb_tree<const_spvtools::opt::analysis::Constant_*,_std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>,_std::_Select1st<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>,_std::less<const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>_>
            ::equal_range(&(this->const_val_to_id_)._M_t,&local_40);
    _Var3 = pVar6.first._M_node;
    _Var4._M_node = _Var3._M_node;
    if (_Var3._M_node == pVar6.second._M_node._M_node) {
      return 0;
    }
    do {
      this_00 = this->ctx_;
      if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(this_00);
      }
      this_01 = DefUseManager::GetDef
                          ((this_00->def_use_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                           _M_head_impl,*(uint32_t *)&_Var4._M_node[1]._M_parent);
      _Var5._M_node = _Var3._M_node;
      if (type_id == 0) {
LAB_0057e520:
        return *(uint32_t *)&_Var5._M_node[1]._M_parent;
      }
      uVar1 = 0;
      if (this_01->has_type_id_ == true) {
        uVar1 = Instruction::GetSingleWordOperand(this_01,0);
      }
      _Var5._M_node = _Var4._M_node;
      if (uVar1 == type_id) goto LAB_0057e520;
      _Var4._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var4._M_node);
    } while (_Var4._M_node != pVar6.second._M_node._M_node);
  }
  return 0;
}

Assistant:

uint32_t ConstantManager::FindDeclaredConstant(const Constant* c,
                                               uint32_t type_id) const {
  c = FindConstant(c);
  if (c == nullptr) {
    return 0;
  }

  for (auto range = const_val_to_id_.equal_range(c);
       range.first != range.second; ++range.first) {
    Instruction* const_def =
        context()->get_def_use_mgr()->GetDef(range.first->second);
    if (type_id == 0 || const_def->type_id() == type_id) {
      return range.first->second;
    }
  }
  return 0;
}